

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::undoUntil
          (HighsPostsolveStack *this,HighsOptions *options,HighsSolution *solution,HighsBasis *basis
          ,size_t numReductions)

{
  byte bVar1;
  byte bVar2;
  HighsOptions *options_00;
  HighsOptions *pHVar3;
  HighsBasis *basis_00;
  HighsBasis *pHVar4;
  reference pvVar5;
  byte *in_RCX;
  long in_RDX;
  HighsSolution *in_RDI;
  ulong in_R8;
  SlackColSubstitution reduction_13;
  DuplicateColumn reduction_12;
  DuplicateRow reduction_11;
  ForcingColumnRemovedRow reduction_10;
  ForcingColumn reduction_9;
  ForcingRow reduction_8;
  RedundantRow reduction_7;
  FixedCol reduction_6;
  SingletonRow reduction_5;
  EqualityRowAdditions reduction_4;
  EqualityRowAddition reduction_3;
  DoubletonEquation reduction_2;
  FreeColSubstitution reduction_1;
  LinearTransform reduction;
  size_t i;
  bool perform_basis_postsolve;
  bool perform_dual_postsolve;
  HighsDataStack *in_stack_fffffffffffffe40;
  HighsPostsolveStack *in_stack_fffffffffffffe60;
  HighsBasis *in_stack_fffffffffffffe68;
  HighsSolution *in_stack_fffffffffffffe70;
  HighsOptions *in_stack_fffffffffffffe78;
  HighsBasis *in_stack_fffffffffffffe80;
  HighsSolution *in_stack_fffffffffffffe88;
  HighsSolution *in_stack_fffffffffffffe90;
  HighsOptions *in_stack_fffffffffffffe98;
  HighsBasis *in_stack_fffffffffffffea0;
  HighsOptions *in_stack_fffffffffffffea8;
  HighsSolution *in_stack_fffffffffffffeb0;
  HighsOptions *in_stack_fffffffffffffeb8;
  ForcingColumn *in_stack_fffffffffffffec0;
  HighsOptions *in_stack_fffffffffffffec8;
  EqualityRowAdditions *in_stack_fffffffffffffed0;
  HighsBasis *in_stack_ffffffffffffff00;
  HighsSolution *in_stack_ffffffffffffff08;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_stack_ffffffffffffff10;
  HighsOptions *in_stack_ffffffffffffff18;
  ForcingRow *in_stack_ffffffffffffff20;
  HighsBasis *in_stack_ffffffffffffff38;
  HighsSolution *in_stack_ffffffffffffff40;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_stack_ffffffffffffff48;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_stack_ffffffffffffff50;
  HighsOptions *in_stack_ffffffffffffff58;
  FreeColSubstitution *in_stack_ffffffffffffff60;
  HighsBasis *in_stack_ffffffffffffff70;
  HighsSolution *in_stack_ffffffffffffff78;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_stack_ffffffffffffff80;
  HighsOptions *in_stack_ffffffffffffff88;
  SlackColSubstitution *in_stack_ffffffffffffff90;
  HighsBasis *in_stack_ffffffffffffff98;
  HighsSolution *in_stack_ffffffffffffffa0;
  HighsOptions *in_stack_ffffffffffffffa8;
  DuplicateColumn *in_stack_ffffffffffffffb0;
  HighsOptions *in_stack_ffffffffffffffb8;
  DoubletonEquation *in_stack_ffffffffffffffc0;
  ulong local_38;
  
  HighsDataStack::resetPosition(in_stack_fffffffffffffe40);
  options_00 = (HighsOptions *)
               std::vector<double,_std::allocator<double>_>::size
                         ((vector<double,_std::allocator<double>_> *)(in_RDX + 8));
  pHVar3 = (HighsOptions *)
           std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)
                      &(in_RDI->row_dual).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (options_00 == pHVar3) {
    basis_00 = (HighsBasis *)
               std::vector<double,_std::allocator<double>_>::size
                         ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x38));
    pHVar4 = (HighsBasis *)
             std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[1].col_value.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    if (basis_00 == pHVar4) {
      bVar1 = *(byte *)(in_RDX + 1);
      bVar2 = *in_RCX;
      undoIterateBackwards<double>
                (in_stack_fffffffffffffe60,(vector<double,_std::allocator<double>_> *)options_00,
                 (vector<int,_std::allocator<int>_> *)in_RDI,(HighsInt)((ulong)basis_00 >> 0x20));
      undoIterateBackwards<double>
                (in_stack_fffffffffffffe60,(vector<double,_std::allocator<double>_> *)options_00,
                 (vector<int,_std::allocator<int>_> *)in_RDI,(HighsInt)((ulong)basis_00 >> 0x20));
      if ((bVar1 & 1) != 0) {
        undoIterateBackwards<double>
                  (in_stack_fffffffffffffe60,(vector<double,_std::allocator<double>_> *)options_00,
                   (vector<int,_std::allocator<int>_> *)in_RDI,(HighsInt)((ulong)basis_00 >> 0x20));
        undoIterateBackwards<double>
                  (in_stack_fffffffffffffe60,(vector<double,_std::allocator<double>_> *)options_00,
                   (vector<int,_std::allocator<int>_> *)in_RDI,(HighsInt)((ulong)basis_00 >> 0x20));
      }
      if ((bVar2 & 1) != 0) {
        undoIterateBackwards<HighsBasisStatus>
                  (in_stack_fffffffffffffe60,
                   (vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)options_00,
                   (vector<int,_std::allocator<int>_> *)in_RDI,(HighsInt)((ulong)basis_00 >> 0x20));
        undoIterateBackwards<HighsBasisStatus>
                  (in_stack_fffffffffffffe60,
                   (vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)options_00,
                   (vector<int,_std::allocator<int>_> *)in_RDI,(HighsInt)((ulong)basis_00 >> 0x20));
      }
      for (local_38 = std::
                      vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                      ::size((vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                              *)&(in_RDI->row_value).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage); in_R8 < local_38;
          local_38 = local_38 - 1) {
        pvVar5 = std::
                 vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                 ::operator[]((vector<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                               *)&(in_RDI->row_value).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,local_38 - 1);
        switch(pvVar5->first) {
        case kLinearTransform:
          HighsDataStack::pop<presolve::HighsPostsolveStack::LinearTransform,_0>
                    ((HighsDataStack *)in_RDI,(LinearTransform *)basis_00);
          LinearTransform::undo((LinearTransform *)in_stack_fffffffffffffe60,options_00,in_RDI);
          break;
        case kFreeColSubstitution:
          HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                    ((HighsDataStack *)in_RDI,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)basis_00);
          HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                    ((HighsDataStack *)in_RDI,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)basis_00);
          HighsDataStack::pop<presolve::HighsPostsolveStack::FreeColSubstitution,_0>
                    ((HighsDataStack *)in_RDI,(FreeColSubstitution *)basis_00);
          FreeColSubstitution::undo
                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          break;
        case kDoubletonEquation:
          HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                    ((HighsDataStack *)in_RDI,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)basis_00);
          HighsDataStack::pop<presolve::HighsPostsolveStack::DoubletonEquation,_0>
                    ((HighsDataStack *)in_RDI,(DoubletonEquation *)basis_00);
          DoubletonEquation::undo
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)in_stack_ffffffffffffffb0,(HighsSolution *)in_stack_ffffffffffffffa8,
                     (HighsBasis *)in_stack_ffffffffffffffa0);
          break;
        case kEqualityRowAddition:
          HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                    ((HighsDataStack *)in_RDI,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)basis_00);
          HighsDataStack::pop<presolve::HighsPostsolveStack::EqualityRowAddition,_0>
                    ((HighsDataStack *)in_RDI,(EqualityRowAddition *)basis_00);
          EqualityRowAddition::undo
                    ((EqualityRowAddition *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                     in_stack_fffffffffffffe80);
          break;
        case kEqualityRowAdditions:
          HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                    ((HighsDataStack *)in_RDI,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)basis_00);
          HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                    ((HighsDataStack *)in_RDI,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)basis_00);
          HighsDataStack::pop<presolve::HighsPostsolveStack::EqualityRowAdditions,_0>
                    ((HighsDataStack *)in_RDI,(EqualityRowAdditions *)basis_00);
          EqualityRowAdditions::undo
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)in_stack_fffffffffffffec0,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                     (HighsBasis *)in_stack_fffffffffffffea8);
          break;
        case kSingletonRow:
          HighsDataStack::pop<presolve::HighsPostsolveStack::SingletonRow,_0>
                    ((HighsDataStack *)in_RDI,(SingletonRow *)basis_00);
          SingletonRow::undo((SingletonRow *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                             in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          break;
        case kFixedCol:
          HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                    ((HighsDataStack *)in_RDI,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)basis_00);
          HighsDataStack::pop<presolve::HighsPostsolveStack::FixedCol,_0>
                    ((HighsDataStack *)in_RDI,(FixedCol *)basis_00);
          FixedCol::undo((FixedCol *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                          *)in_stack_fffffffffffffea0,(HighsSolution *)in_stack_fffffffffffffe98,
                         (HighsBasis *)in_stack_fffffffffffffe90);
          break;
        case kRedundantRow:
          HighsDataStack::pop<presolve::HighsPostsolveStack::RedundantRow,_0>
                    ((HighsDataStack *)in_RDI,(RedundantRow *)basis_00);
          RedundantRow::undo((RedundantRow *)in_stack_fffffffffffffe60,options_00,in_RDI,basis_00);
          break;
        case kForcingRow:
          HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                    ((HighsDataStack *)in_RDI,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)basis_00);
          HighsDataStack::pop<presolve::HighsPostsolveStack::ForcingRow,_0>
                    ((HighsDataStack *)in_RDI,(ForcingRow *)basis_00);
          ForcingRow::undo(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                           in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                           in_stack_ffffffffffffff00);
          break;
        case kForcingColumn:
          HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                    ((HighsDataStack *)in_RDI,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)basis_00);
          HighsDataStack::pop<presolve::HighsPostsolveStack::ForcingColumn,_0>
                    ((HighsDataStack *)in_RDI,(ForcingColumn *)basis_00);
          ForcingColumn::undo(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                              (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                               *)in_stack_fffffffffffffeb0,
                              (HighsSolution *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
          break;
        case kForcingColumnRemovedRow:
          HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                    ((HighsDataStack *)in_RDI,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)basis_00);
          HighsDataStack::pop<presolve::HighsPostsolveStack::ForcingColumnRemovedRow,_0>
                    ((HighsDataStack *)in_RDI,(ForcingColumnRemovedRow *)basis_00);
          ForcingColumnRemovedRow::undo
                    ((ForcingColumnRemovedRow *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                     in_stack_fffffffffffffe80);
          break;
        case kDuplicateRow:
          HighsDataStack::pop<presolve::HighsPostsolveStack::DuplicateRow,_0>
                    ((HighsDataStack *)in_RDI,(DuplicateRow *)basis_00);
          DuplicateRow::undo((DuplicateRow *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                             in_stack_fffffffffffffe90,(HighsBasis *)in_stack_fffffffffffffe88);
          break;
        case kDuplicateColumn:
          HighsDataStack::pop<presolve::HighsPostsolveStack::DuplicateColumn,_0>
                    ((HighsDataStack *)in_RDI,(DuplicateColumn *)basis_00);
          DuplicateColumn::undo
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98);
        case kSlackColSubstitution:
          HighsDataStack::pop<presolve::HighsPostsolveStack::Nonzero>
                    ((HighsDataStack *)in_RDI,
                     (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                      *)basis_00);
          HighsDataStack::pop<presolve::HighsPostsolveStack::SlackColSubstitution,_0>
                    ((HighsDataStack *)in_RDI,(SlackColSubstitution *)basis_00);
          SlackColSubstitution::undo
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        }
      }
    }
  }
  return;
}

Assistant:

void undoUntil(const HighsOptions& options, HighsSolution& solution,
                 HighsBasis& basis, size_t numReductions) {
    reductionValues.resetPosition();

    // Do these returns ever happen? How is it known that undo has not
    // been performed?
    assert(solution.col_value.size() == origColIndex.size());
    assert(solution.row_value.size() == origRowIndex.size());
    // This should be a better measure of whether undo can be
    // performed
    assert(solution.value_valid);
    if (solution.col_value.size() != origColIndex.size()) return;
    if (solution.row_value.size() != origRowIndex.size()) return;

    bool perform_dual_postsolve = solution.dual_valid;
    assert((solution.col_dual.size() == solution.col_value.size()) ==
           perform_dual_postsolve);
    bool perform_basis_postsolve = basis.valid;

    // expand solution to original index space
    undoIterateBackwards(solution.col_value, origColIndex, origNumCol);

    undoIterateBackwards(solution.row_value, origRowIndex, origNumRow);

    if (perform_dual_postsolve) {
      // if dual solution is given, expand dual solution and basis to original
      // index space
      undoIterateBackwards(solution.col_dual, origColIndex, origNumCol);

      undoIterateBackwards(solution.row_dual, origRowIndex, origNumRow);
    }

    if (perform_basis_postsolve) {
      // if basis is given, expand basis status values to original index space
      undoIterateBackwards(basis.col_status, origColIndex, origNumCol);

      undoIterateBackwards(basis.row_status, origRowIndex, origNumRow);
    }

    // now undo the changes
    for (size_t i = reductions.size(); i > numReductions; --i) {
      switch (reductions[i - 1].first) {
        case ReductionType::kLinearTransform: {
          LinearTransform reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution);
          break;
        }
        case ReductionType::kFreeColSubstitution: {
          FreeColSubstitution reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, colValues, solution, basis);
          break;
        }
        case ReductionType::kDoubletonEquation: {
          DoubletonEquation reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(reduction);
          reduction.undo(options, colValues, solution, basis);
          break;
        }
        case ReductionType::kEqualityRowAddition: {
          EqualityRowAddition reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
        case ReductionType::kEqualityRowAdditions: {
          EqualityRowAdditions reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, colValues, solution, basis);
          break;
        }
        case ReductionType::kSingletonRow: {
          SingletonRow reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
          break;
        }
        case ReductionType::kFixedCol: {
          FixedCol reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(reduction);
          reduction.undo(options, colValues, solution, basis);
          break;
        }
        case ReductionType::kRedundantRow: {
          RedundantRow reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
          break;
        }
        case ReductionType::kForcingRow: {
          ForcingRow reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
        case ReductionType::kForcingColumn: {
          ForcingColumn reduction;
          reductionValues.pop(colValues);
          reductionValues.pop(reduction);
          reduction.undo(options, colValues, solution, basis);
          break;
        }
        case ReductionType::kForcingColumnRemovedRow: {
          ForcingColumnRemovedRow reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
        case ReductionType::kDuplicateRow: {
          DuplicateRow reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
          break;
        }
        case ReductionType::kDuplicateColumn: {
          DuplicateColumn reduction;
          reductionValues.pop(reduction);
          reduction.undo(options, solution, basis);
        }
        case ReductionType::kSlackColSubstitution: {
          SlackColSubstitution reduction;
          reductionValues.pop(rowValues);
          reductionValues.pop(reduction);
          reduction.undo(options, rowValues, solution, basis);
          break;
        }
      }
    }
#ifdef DEBUG_EXTRA
    // solution should not contain NaN or Inf
    assert(!containsNanOrInf(solution.col_value));
    // row values are not determined by postsolve
    // assert(!containsNanOrInf(solution.row_value));
    assert(!containsNanOrInf(solution.col_dual));
    assert(!containsNanOrInf(solution.row_dual));
#endif
  }